

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

void uninitialize_all_placeholders(Am_Object *execute_command)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object ph;
  Am_Assoc as;
  Am_Value_List ph_list;
  Am_Value local_40;
  
  pAVar2 = Am_Object::Get(execute_command,Am_PLACEHOLDER_LIST,0);
  Am_Value_List::Am_Value_List(&ph_list,pAVar2);
  as.data = (Am_Assoc_Data *)0x0;
  ph.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&ph_list);
  while( true ) {
    bVar1 = Am_Value_List::Last(&ph_list);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&ph_list);
    Am_Assoc::operator=(&as,pAVar2);
    Am_Assoc::Value_2((Am_Assoc *)&local_40);
    Am_Object::operator=(&ph,&local_40);
    Am_Value::~Am_Value(&local_40);
    Am_Object::Set(&ph,Am_PLACEHOLDER_INITIALIZED,false,1);
    Am_Value_List::Next(&ph_list);
  }
  Am_Object::~Am_Object(&ph);
  Am_Assoc::~Am_Assoc(&as);
  Am_Value_List::~Am_Value_List(&ph_list);
  return;
}

Assistant:

void
uninitialize_all_placeholders(Am_Object &execute_command)
{
  Am_Value_List ph_list = execute_command.Get(Am_PLACEHOLDER_LIST);
  Am_Assoc as;
  Am_Object ph;
  for (ph_list.Start(); !ph_list.Last(); ph_list.Next()) {
    as = ph_list.Get();
    ph = as.Value_2();
    ph.Set(Am_PLACEHOLDER_INITIALIZED, false, Am_OK_IF_NOT_THERE);
  }
}